

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O2

void __thiscall p2t::Triangle::MarkConstrainedEdge(Triangle *this,Point *p,Point *q)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)this->points_[0] ^ (ulong)q;
  uVar2 = (ulong)this->points_[1] ^ (ulong)p;
  if (uVar5 != 0 || uVar2 != 0) {
    uVar1 = (ulong)this->points_[1] ^ (ulong)q;
    uVar4 = (ulong)this->points_[0] ^ (ulong)p;
    if (uVar4 != 0 || uVar1 != 0) {
      uVar3 = (ulong)p ^ (ulong)this->points_[2];
      if ((uVar5 != 0 || uVar3 != 0) &&
         (uVar5 = (ulong)this->points_[2] ^ (ulong)q, uVar4 != 0 || uVar5 != 0)) {
        if ((uVar1 == 0 && uVar3 == 0) || (uVar5 == 0 && uVar2 == 0)) {
          this->constrained_edge[0] = true;
        }
        return;
      }
      this->constrained_edge[1] = true;
      return;
    }
  }
  this->constrained_edge[2] = true;
  return;
}

Assistant:

void Triangle::MarkConstrainedEdge(Point* p, Point* q)
{
  if ((q == points_[0] && p == points_[1]) || (q == points_[1] && p == points_[0])) {
    constrained_edge[2] = true;
  } else if ((q == points_[0] && p == points_[2]) || (q == points_[2] && p == points_[0])) {
    constrained_edge[1] = true;
  } else if ((q == points_[1] && p == points_[2]) || (q == points_[2] && p == points_[1])) {
    constrained_edge[0] = true;
  }
}